

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

long divsufsortxx::core::sort_typeBstar<char*,bitmap::BitmapArray<long>::iterator,long,int>
               (char *T,iterator SA,long *bucket_A,long *bucket_B,long n,long SAsize,
               int alphabetsize)

{
  iterator PA;
  iterator first;
  iterator last;
  iterator PA_00;
  iterator last_00;
  iterator buf_00;
  iterator last_01;
  iterator first_00;
  iterator ISA;
  bool bVar1;
  BitmapArray<long> *pBVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  difference_type dVar6;
  undefined7 extraout_var;
  long in_RCX;
  value_reference *pvVar7;
  long lVar8;
  pos_type extraout_RDX;
  long in_RDI;
  long lVar9;
  long in_R8;
  long in_R9;
  iterator iVar10;
  iterator iVar11;
  iterator iVar12;
  reference ISA_00;
  reference rVar13;
  long in_stack_00000008;
  int in_stack_00000010;
  bool in_stack_00000097;
  long *in_stack_00000098;
  char *in_stack_000000a0;
  undefined1 in_stack_000000a8 [15];
  bool in_stack_000000b7;
  BitmapArray<long> *in_stack_000000b8;
  char *in_stack_000000c0;
  BitmapArray<long> *in_stack_000000c8;
  BitmapArray<long> *in_stack_000000d0;
  BitmapArray<long> *in_stack_000000d8;
  pos_type in_stack_000000e0;
  value_type in_stack_000000e8;
  BitmapArray<long> *in_stack_000000f0;
  pos_type in_stack_000000f8;
  int in_stack_00000100;
  undefined1 in_stack_00000104 [12];
  value_type in_stack_00000110;
  value_type in_stack_00000118;
  int in_stack_00000128;
  int err;
  long *lbuf;
  iterator buf;
  iterator ISAb;
  iterator PAb;
  int c1;
  int c0;
  long bufsize;
  long m;
  long t;
  long k;
  long j;
  long i;
  ulong in_stack_fffffffffffff9e0;
  value_reference *in_stack_fffffffffffff9e8;
  value_reference *in_stack_fffffffffffff9f0;
  iterator iStack_5d0;
  reference rStack_5c0;
  reference rStack_5b0;
  reference rStack_5a0;
  iterator iStack_590;
  iterator iStack_580;
  reference rStack_570;
  reference rStack_560;
  iterator iStack_550;
  iterator iStack_540;
  reference rStack_530;
  reference rStack_520;
  reference rStack_510;
  reference rStack_500;
  iterator iStack_4f0;
  iterator iStack_4e0;
  int iStack_4cc;
  int iStack_4c8;
  int iStack_4c4;
  value_reference *pvStack_4c0;
  iterator iStack_4b8;
  iterator iStack_4a8;
  iterator iStack_498;
  long lStack_488;
  long lStack_480;
  long lStack_478;
  long lStack_470;
  BitmapArray<long> *pBStack_468;
  pos_type pVar14;
  BitmapArray<long> *in_stack_fffffffffffffba8;
  value_reference *in_stack_fffffffffffffbb0;
  BitmapArray<long> *in_stack_fffffffffffffbb8;
  iterator *in_stack_fffffffffffffbc0;
  BitmapArray<long> *in_stack_fffffffffffffdf0;
  BitmapArray<long> *in_stack_fffffffffffffdf8;
  BitmapArray<long> *in_stack_fffffffffffffe00;
  BitmapArray<long> *in_stack_fffffffffffffe08;
  BitmapArray<long> *in_stack_fffffffffffffe10;
  BitmapArray<long> *in_stack_fffffffffffffe18;
  reference in_stack_fffffffffffffe28;
  BitmapArray<long> *in_stack_fffffffffffffe38;
  pos_type in_stack_fffffffffffffe40;
  BitmapArray<long> *in_stack_fffffffffffffe48;
  pos_type in_stack_fffffffffffffe50;
  BitmapArray<long> *local_128;
  value_reference *pvStack_120;
  BitmapArray<long> *local_f8;
  iterator *local_f0;
  int local_68;
  int local_64;
  long local_58;
  long local_48;
  long local_40;
  long local_38;
  
  for (local_38 = 0; local_38 < in_stack_00000010; local_38 = local_38 + 1) {
    *(undefined8 *)(in_RCX + local_38 * 8) = 0;
  }
  for (local_38 = 0; local_38 < in_stack_00000010 * in_stack_00000010; local_38 = local_38 + 1) {
    *(undefined8 *)(in_R8 + local_38 * 8) = 0;
  }
  local_58 = in_stack_00000008;
  lVar5 = in_R8;
  lVar4 = in_R9;
  local_128 = in_stack_fffffffffffffba8;
  pvStack_120 = in_stack_fffffffffffffbb0;
  local_f0 = in_stack_fffffffffffffbc0;
  lVar8 = in_R9 + -1;
  while (local_38 = lVar8, lVar8 = local_38, -1 < local_38) {
    do {
      local_38 = lVar8;
      *(long *)(in_RCX + (long)*(char *)(in_RDI + local_38) * 8) =
           *(long *)(in_RCX + (long)*(char *)(in_RDI + local_38) * 8) + 1;
      lVar8 = local_38 + -1;
      bVar1 = false;
      if (-1 < lVar8) {
        bVar1 = *(char *)(in_RDI + 1 + lVar8) <= *(char *)(in_RDI + lVar8);
      }
    } while (bVar1);
    if (-1 < lVar8) {
      lVar8 = (long)(*(char *)(in_RDI + lVar8) * in_stack_00000010 +
                    (int)*(char *)(in_RDI + 1 + lVar8));
      *(long *)(in_R8 + lVar8 * 8) = *(long *)(in_R8 + lVar8 * 8) + 1;
      local_58 = local_58 + -1;
      bitmap::BitmapArray<long>::iterator::operator[]
                (local_f0,(difference_type)in_stack_fffffffffffffbb8);
      bitmap::BitmapArray<long>::value_reference::operator=(pvStack_120,(long)local_128);
      local_38 = local_38 + -2;
      while( true ) {
        bVar1 = false;
        if (-1 < local_38) {
          bVar1 = *(char *)(in_RDI + local_38) <= *(char *)(in_RDI + 1 + local_38);
        }
        lVar8 = local_38;
        if (!bVar1) break;
        lVar8 = (long)(*(char *)(in_RDI + 1 + local_38) * in_stack_00000010 +
                      (int)*(char *)(in_RDI + local_38));
        *(long *)(in_R8 + lVar8 * 8) = *(long *)(in_R8 + lVar8 * 8) + 1;
        local_38 = local_38 + -1;
      }
    }
  }
  local_58 = in_stack_00000008 - local_58;
  local_38 = -1;
  local_40 = 0;
  for (local_64 = 0; local_64 < in_stack_00000010; local_64 = local_64 + 1) {
    lVar8 = *(long *)(in_RCX + (long)local_64 * 8);
    *(long *)(in_RCX + (long)local_64 * 8) = local_38 + local_40;
    local_38 = local_38 + lVar8 +
               *(long *)(in_R8 + (long)(local_64 * in_stack_00000010 + local_64) * 8);
    local_68 = local_64;
    while (local_68 = local_68 + 1, local_68 < in_stack_00000010) {
      local_40 = *(long *)(in_R8 + (long)(local_64 * in_stack_00000010 + local_68) * 8) + local_40;
      *(long *)(in_R8 + (long)(local_64 * in_stack_00000010 + local_68) * 8) = local_40;
      local_38 = *(long *)(in_R8 + (long)(local_68 * in_stack_00000010 + local_64) * 8) + local_38;
    }
  }
  if (0 < local_58) {
    bitmap::BitmapArray<long>::iterator::operator+
              ((iterator *)in_stack_fffffffffffffbb8,(difference_type)pvStack_120);
    bitmap::BitmapArray<long>::iterator::operator-
              ((iterator *)in_stack_fffffffffffffbb8,(difference_type)pvStack_120);
    bitmap::BitmapArray<long>::iterator::operator+
              ((iterator *)in_stack_fffffffffffffbb8,(difference_type)pvStack_120);
    for (local_38 = local_58 + -2; -1 < local_38; local_38 = local_38 + -1) {
      bitmap::BitmapArray<long>::iterator::operator[]
                (local_f0,(difference_type)in_stack_fffffffffffffbb8);
      lVar8 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x10fc25);
      lVar8 = (long)(*(char *)(in_RDI + lVar8) * in_stack_00000010 +
                    (int)*(char *)(in_RDI + 1 + lVar8));
      *(long *)(in_R8 + lVar8 * 8) = *(long *)(in_R8 + lVar8 * 8) + -1;
      bitmap::BitmapArray<long>::iterator::operator[]
                (local_f0,(difference_type)in_stack_fffffffffffffbb8);
      bitmap::BitmapArray<long>::value_reference::operator=(pvStack_120,(long)local_128);
    }
    bitmap::BitmapArray<long>::iterator::operator[]
              (local_f0,(difference_type)in_stack_fffffffffffffbb8);
    lVar8 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x10fd22)
    ;
    pBVar2 = (BitmapArray<long> *)(local_58 + -1);
    lVar8 = (long)(*(char *)(in_RDI + lVar8) * in_stack_00000010 +
                  (int)*(char *)(in_RDI + 1 + lVar8));
    *(long *)(in_R8 + lVar8 * 8) = *(long *)(in_R8 + lVar8 * 8) + -1;
    bitmap::BitmapArray<long>::iterator::operator[]
              (local_f0,(difference_type)in_stack_fffffffffffffbb8);
    bitmap::BitmapArray<long>::value_reference::operator=(pvStack_120,(long)local_128);
    lVar8 = local_58 * 2;
    local_40 = local_58;
    if (in_stack_00000008 + local_58 * -2 < 0x101) {
      lVar9 = 0x800;
      pvVar3 = operator_new__(0x800);
      ISA_00.pos_ = in_stack_fffffffffffffe50;
      ISA_00.array_ = in_stack_fffffffffffffe48;
      iVar12.pos_ = in_stack_fffffffffffffe40;
      iVar12.array_ = in_stack_fffffffffffffe38;
      iVar11.pos_ = (pos_type)pvStack_120;
      iVar11.array_ = local_128;
      if (pvVar3 == (void *)0x0) {
        __cxa_rethrow();
        lStack_488 = lVar4;
        lStack_480 = lVar5;
        lStack_478 = lVar8;
        lStack_470 = lVar9;
        pBStack_468 = pBVar2;
        pVar14 = extraout_RDX;
        bitmap::BitmapArray<long>::iterator::iterator(&iStack_498);
        iStack_4b8.pos_ = pVar14;
        bitmap::BitmapArray<long>::iterator::iterator(&iStack_4a8);
        iStack_4b8.array_ = pBStack_468;
        if (0 < (long)pvStack_120) {
          for (iStack_4c8 = (int)in_stack_fffffffffffffbb8 + -2; -1 < iStack_4c8;
              iStack_4c8 = iStack_4c8 + -1) {
            iStack_4e0 = bitmap::BitmapArray<long>::iterator::operator+
                                   ((iterator *)in_stack_fffffffffffff9f0,
                                    (difference_type)in_stack_fffffffffffff9e8);
            bitmap::BitmapArray<long>::iterator::operator=(&iStack_498,&iStack_4e0);
            iStack_4f0 = bitmap::BitmapArray<long>::iterator::operator+
                                   ((iterator *)in_stack_fffffffffffff9f0,
                                    (difference_type)in_stack_fffffffffffff9e8);
            bitmap::BitmapArray<long>::iterator::operator=(&iStack_4a8,&iStack_4f0);
            iStack_4cc = -1;
            while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&iStack_498,&iStack_4a8),
                  bVar1) {
              bitmap::BitmapArray<long>::iterator::operator--(&iStack_4a8);
              rStack_500 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x110ef9);
              pvStack_4c0 = (value_reference *)
                            bitmap::BitmapArray::value_reference::operator_cast_to_long
                                      ((value_reference *)0x110f16);
              if ((long)pvStack_4c0 < 0) {
                rStack_560 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x111174);
                bitmap::BitmapArray<long>::value_reference::operator=
                          (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
              }
              else {
                pvStack_4c0 = (value_reference *)((long)&pvStack_4c0[-1].pos_ + 7);
                if ((-1 < (long)pvStack_4c0) &&
                   (iStack_4c4 = (int)*(char *)((long)&pvStack_4c0->array_ + lStack_470),
                   iStack_4c4 <= iStack_4c8)) {
                  rStack_510 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x110f95);
                  bitmap::BitmapArray<long>::value_reference::operator=
                            (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
                  if ((0 < (long)pvStack_4c0) &&
                     (iStack_4c4 < *(char *)((long)pvStack_4c0 + lStack_470 + -1))) {
                    pvStack_4c0 = (value_reference *)((ulong)pvStack_4c0 ^ 0xffffffffffffffff);
                  }
                  if (iStack_4cc == iStack_4c4) {
                    bitmap::BitmapArray<long>::iterator::operator--(&iStack_4b8);
                    rStack_520 = bitmap::BitmapArray<long>::iterator::operator*
                                           ((iterator *)0x11102a);
                    bitmap::BitmapArray<long>::value_reference::operator=
                              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
                  }
                  else {
                    if (-1 < iStack_4cc) {
                      dVar6 = bitmap::BitmapArray<long>::iterator::operator-
                                        (&iStack_4b8,(iterator *)&pBStack_468);
                      *(difference_type *)
                       (lStack_480 +
                       (long)(iStack_4c8 * (int)in_stack_fffffffffffffbb8 + iStack_4cc) * 8) = dVar6
                      ;
                    }
                    iStack_4cc = iStack_4c4;
                    iStack_550 = bitmap::BitmapArray<long>::iterator::operator+
                                           ((iterator *)in_stack_fffffffffffff9f0,
                                            (difference_type)in_stack_fffffffffffff9e8);
                    iStack_540 = bitmap::BitmapArray<long>::iterator::operator-
                                           ((iterator *)in_stack_fffffffffffff9f0,
                                            (difference_type)in_stack_fffffffffffff9e8);
                    bitmap::BitmapArray<long>::iterator::operator=(&iStack_4b8,&iStack_540);
                    rStack_530 = bitmap::BitmapArray<long>::iterator::operator*
                                           ((iterator *)0x111130);
                    bitmap::BitmapArray<long>::value_reference::operator=
                              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
                  }
                }
              }
            }
          }
        }
        iStack_4cc = (int)*(char *)(lStack_470 + lStack_488 + -1);
        iStack_580 = bitmap::BitmapArray<long>::iterator::operator+
                               ((iterator *)in_stack_fffffffffffff9f0,
                                (difference_type)in_stack_fffffffffffff9e8);
        bitmap::BitmapArray<long>::iterator::operator=(&iStack_4b8,&iStack_580);
        rStack_570 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x111232);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
        bitmap::BitmapArray<long>::iterator::operator=(&iStack_498,(iterator *)&pBStack_468);
        iStack_590 = bitmap::BitmapArray<long>::iterator::operator+
                               ((iterator *)in_stack_fffffffffffff9f0,
                                (difference_type)in_stack_fffffffffffff9e8);
        bitmap::BitmapArray<long>::iterator::operator=(&iStack_4a8,&iStack_590);
        while( true ) {
          bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&iStack_498,&iStack_4a8);
          if (!bVar1) break;
          rStack_5a0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1112ce);
          pvStack_4c0 = (value_reference *)
                        bitmap::BitmapArray::value_reference::operator_cast_to_long
                                  ((value_reference *)0x1112eb);
          if ((long)pvStack_4c0 < 0) {
            in_stack_fffffffffffff9e0 = (ulong)pvStack_4c0 ^ 0xffffffffffffffff;
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1114ae);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
            pvVar7 = pvStack_4c0;
          }
          else {
            pvVar7 = (value_reference *)((long)&pvStack_4c0[-1].pos_ + 7);
            if ((-1 < (long)pvVar7) &&
               (iStack_4c4 = (int)*(char *)((long)&pvVar7->array_ + lStack_470),
               *(char *)((long)&pvVar7->array_ + lStack_470 + 1) <= iStack_4c4)) {
              if ((0 < (long)pvVar7) &&
                 (*(char *)((long)pvStack_4c0 + lStack_470 + -2) < iStack_4c4)) {
                pvVar7 = (value_reference *)((ulong)pvVar7 ^ 0xffffffffffffffff);
              }
              pvStack_4c0 = pvVar7;
              if (iStack_4c4 == iStack_4cc) {
                in_stack_fffffffffffff9f0 = pvStack_4c0;
                bitmap::BitmapArray<long>::iterator::operator++(&iStack_4b8);
                rStack_5b0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1113cb);
                bitmap::BitmapArray<long>::value_reference::operator=
                          (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
                pvVar7 = pvStack_4c0;
              }
              else {
                dVar6 = bitmap::BitmapArray<long>::iterator::operator-
                                  (&iStack_4b8,(iterator *)&pBStack_468);
                *(difference_type *)(lStack_478 + (long)iStack_4cc * 8) = dVar6;
                iStack_4cc = iStack_4c4;
                in_stack_fffffffffffff9e8 = pvStack_4c0;
                iStack_5d0 = bitmap::BitmapArray<long>::iterator::operator+
                                       ((iterator *)in_stack_fffffffffffff9f0,
                                        (difference_type)pvStack_4c0);
                bitmap::BitmapArray<long>::iterator::operator=(&iStack_4b8,&iStack_5d0);
                rStack_5c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x111474);
                bitmap::BitmapArray<long>::value_reference::operator=
                          (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
                pvVar7 = pvStack_4c0;
              }
            }
          }
          pvStack_4c0 = pvVar7;
          bitmap::BitmapArray<long>::iterator::operator++(&iStack_498);
        }
        return CONCAT71(extraout_var,bVar1);
      }
      local_64 = in_stack_00000010 + -1;
      while (0 < local_40) {
        for (local_68 = in_stack_00000010 + -1; local_64 < local_68; local_68 = local_68 + -1) {
          lVar5 = *(long *)(in_R8 + (long)(local_64 * in_stack_00000010 + local_68) * 8);
          if (1 < local_40 - lVar5) {
            bitmap::BitmapArray<long>::iterator::operator+
                      ((iterator *)in_stack_fffffffffffffbb8,iVar11.pos_);
            iVar12 = iVar11;
            iVar11 = bitmap::BitmapArray<long>::iterator::operator+
                               ((iterator *)in_stack_fffffffffffffbb8,iVar11.pos_);
            iVar12 = bitmap::BitmapArray<long>::iterator::operator+
                               ((iterator *)in_stack_fffffffffffffbb8,iVar12.pos_);
            ISA_00 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11031c);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11035b)
            ;
            local_f0 = (iterator *)0x2;
            in_stack_fffffffffffffbb8 = (BitmapArray<long> *)0x100;
            PA.pos_ = (pos_type)in_stack_000000c0;
            PA.array_ = in_stack_000000b8;
            iVar10.pos_._7_1_ = in_stack_000000b7;
            iVar10._0_15_ = in_stack_000000a8;
            last.pos_ = (pos_type)in_stack_000000d8;
            last.array_ = in_stack_000000d0;
            substring::sort<char*,bitmap::BitmapArray<long>::iterator,long*>
                      (in_stack_000000a0,PA,iVar10,last,in_stack_00000098,in_stack_000000e0,
                       in_stack_000000e8,(value_type)in_stack_000000f0,in_stack_00000097,
                       in_stack_00000100);
          }
          local_40 = lVar5;
        }
        local_64 = local_64 + -1;
      }
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
    }
    else {
      iVar10 = bitmap::BitmapArray<long>::iterator::operator+
                         ((iterator *)in_stack_fffffffffffffbb8,(difference_type)pvStack_120);
      local_64 = in_stack_00000010 + -1;
      while( true ) {
        ISA_00.pos_ = in_stack_fffffffffffffe50;
        ISA_00.array_ = in_stack_fffffffffffffe48;
        iVar12.pos_ = in_stack_fffffffffffffe40;
        iVar12.array_ = in_stack_fffffffffffffe38;
        iVar11.pos_ = (pos_type)pvStack_120;
        iVar11.array_ = local_128;
        if (local_40 < 1) break;
        for (local_68 = in_stack_00000010 + -1; local_64 < local_68; local_68 = local_68 + -1) {
          lVar5 = *(long *)(in_R8 + (long)(local_64 * in_stack_00000010 + local_68) * 8);
          local_f8 = in_stack_fffffffffffffbb8;
          if (1 < local_40 - lVar5) {
            bitmap::BitmapArray<long>::iterator::operator+
                      ((iterator *)in_stack_fffffffffffffbb8,(difference_type)pvStack_120);
            iVar11 = bitmap::BitmapArray<long>::iterator::operator+
                               ((iterator *)in_stack_fffffffffffffbb8,(difference_type)pvStack_120);
            local_f8 = iVar10.array_;
            local_f0 = (iterator *)iVar10.pos_;
            bitmap::BitmapArray<long>::iterator::operator+
                      ((iterator *)in_stack_fffffffffffffbb8,(difference_type)pvStack_120);
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x10ffb7);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x10ffd4)
            ;
            local_128 = iVar11.array_;
            pvStack_120 = (value_reference *)iVar11.pos_;
            PA_00.pos_ = in_stack_000000e0;
            PA_00.array_ = in_stack_000000d8;
            first.pos_ = (pos_type)in_stack_000000d0;
            first.array_ = in_stack_000000c8;
            last_00.pos_ = in_stack_000000f8;
            last_00.array_ = in_stack_000000f0;
            buf_00._4_12_ = in_stack_00000104;
            buf_00.array_._0_4_ = in_stack_00000100;
            substring::
            sort<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                      (in_stack_000000c0,PA_00,first,last_00,buf_00,(value_type)in_stack_000000b8,
                       in_stack_00000110,in_stack_00000118,in_stack_000000b7,in_stack_00000128);
          }
          in_stack_fffffffffffffbb8 = local_f8;
          local_40 = lVar5;
        }
        local_64 = local_64 + -1;
      }
    }
    for (local_38 = local_58 + -1; -1 < local_38; local_38 = local_38 + -2) {
      in_stack_fffffffffffffe28 =
           bitmap::BitmapArray<long>::iterator::operator[]
                     (local_f0,(difference_type)in_stack_fffffffffffffbb8);
      lVar4 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x11048e);
      lVar5 = local_38;
      if (-1 < lVar4) {
        do {
          rVar13 = bitmap::BitmapArray<long>::iterator::operator[]
                             (local_f0,(difference_type)in_stack_fffffffffffffbb8);
          in_stack_fffffffffffffe08 = rVar13.array_;
          in_stack_fffffffffffffe10 = (BitmapArray<long> *)rVar13.pos_;
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1104ee);
          rVar13 = bitmap::BitmapArray<long>::iterator::operator[]
                             (local_f0,(difference_type)in_stack_fffffffffffffbb8);
          in_stack_fffffffffffffe18 = rVar13.array_;
          bitmap::BitmapArray<long>::value_reference::operator=
                    ((value_reference *)iVar11.pos_,(long)iVar11.array_);
          local_38 = local_38 + -1;
          bVar1 = false;
          if (-1 < local_38) {
            rVar13 = bitmap::BitmapArray<long>::iterator::operator[]
                               (local_f0,(difference_type)in_stack_fffffffffffffbb8);
            in_stack_fffffffffffffdf8 = rVar13.array_;
            in_stack_fffffffffffffe00 = (BitmapArray<long> *)rVar13.pos_;
            lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x110579);
            bVar1 = -1 < lVar5;
          }
        } while (bVar1);
        rVar13 = bitmap::BitmapArray<long>::iterator::operator[]
                           (local_f0,(difference_type)in_stack_fffffffffffffbb8);
        in_stack_fffffffffffffdf0 = (BitmapArray<long> *)rVar13.pos_;
        bitmap::BitmapArray<long>::value_reference::operator=
                  ((value_reference *)iVar11.pos_,(long)iVar11.array_);
        lVar5 = local_38;
        if (local_38 < 1) break;
      }
      do {
        local_38 = lVar5;
        bitmap::BitmapArray<long>::iterator::operator[]
                  (local_f0,(difference_type)in_stack_fffffffffffffbb8);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11064b);
        bitmap::BitmapArray<long>::iterator::operator[]
                  (local_f0,(difference_type)in_stack_fffffffffffffbb8);
        bitmap::BitmapArray<long>::value_reference::operator=
                  ((value_reference *)iVar11.pos_,(long)iVar11.array_);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x110693);
        bitmap::BitmapArray<long>::iterator::operator[]
                  (local_f0,(difference_type)in_stack_fffffffffffffbb8);
        bitmap::BitmapArray<long>::value_reference::operator=
                  ((value_reference *)iVar11.pos_,(long)iVar11.array_);
        bitmap::BitmapArray<long>::iterator::operator[]
                  (local_f0,(difference_type)in_stack_fffffffffffffbb8);
        lVar4 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x110703);
        lVar5 = local_38 + -1;
      } while (lVar4 < 0);
      bitmap::BitmapArray<long>::iterator::operator[]
                (local_f0,(difference_type)in_stack_fffffffffffffbb8);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11074c);
      bitmap::BitmapArray<long>::iterator::operator[]
                (local_f0,(difference_type)in_stack_fffffffffffffbb8);
      bitmap::BitmapArray<long>::value_reference::operator=
                ((value_reference *)iVar11.pos_,(long)iVar11.array_);
    }
    bitmap::BitmapArray<long>::iterator::operator+
              ((iterator *)in_stack_fffffffffffffbb8,iVar11.pos_);
    ISA.pos_ = (pos_type)in_stack_fffffffffffffe18;
    ISA.array_ = in_stack_fffffffffffffe10;
    first_00.pos_ = (pos_type)in_stack_fffffffffffffe08;
    first_00.array_ = in_stack_fffffffffffffe00;
    last_01.pos_ = (pos_type)in_stack_fffffffffffffdf8;
    last_01.array_ = in_stack_fffffffffffffdf0;
    bVar1 = tandemrepeat::
            sort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                      (ISA,first_00,last_01);
    if (!bVar1) {
      bitmap::BitmapArray<long>::iterator::operator+
                ((iterator *)in_stack_fffffffffffffbb8,iVar11.pos_);
      doubling::sort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                ((iterator)ISA_00,iVar12,(iterator)in_stack_fffffffffffffe28);
    }
    local_38 = in_R9 + -1;
    while (-1 < local_38) {
      do {
        lVar5 = local_38;
        local_38 = lVar5 + -1;
        bVar1 = false;
        if (-1 < local_38) {
          bVar1 = *(char *)(in_RDI + 1 + local_38) <= *(char *)(in_RDI + local_38);
        }
      } while (bVar1);
      if (-1 < local_38) {
        bitmap::BitmapArray<long>::iterator::operator[]
                  (local_f0,(difference_type)in_stack_fffffffffffffbb8);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1109e2);
        bitmap::BitmapArray<long>::iterator::operator[]
                  (local_f0,(difference_type)in_stack_fffffffffffffbb8);
        bitmap::BitmapArray<long>::value_reference::operator=
                  ((value_reference *)iVar11.pos_,(long)iVar11.array_);
        local_38 = lVar5 + -2;
        while( true ) {
          bVar1 = false;
          if (-1 < local_38) {
            bVar1 = *(char *)(in_RDI + local_38) <= *(char *)(in_RDI + 1 + local_38);
          }
          if (!bVar1) break;
          local_38 = local_38 + -1;
        }
      }
    }
    local_38 = in_R9 + -1;
    local_48 = local_58 + -1;
    for (local_64 = in_stack_00000010 + -1; -1 < local_64; local_64 = local_64 + -1) {
      for (local_68 = in_stack_00000010 + -1; local_64 < local_68; local_68 = local_68 + -1) {
        lVar5 = *(long *)(in_R8 + (long)(local_68 * in_stack_00000010 + local_64) * 8);
        *(long *)(in_R8 + (long)(local_68 * in_stack_00000010 + local_64) * 8) = local_38 + 1;
        lVar4 = *(long *)(in_R8 + (long)(local_64 * in_stack_00000010 + local_68) * 8);
        local_38 = local_38 - lVar5;
        for (; lVar4 <= local_48; local_48 = local_48 + -1) {
          bitmap::BitmapArray<long>::iterator::operator[]
                    (local_f0,(difference_type)in_stack_fffffffffffffbb8);
          bitmap::BitmapArray<long>::iterator::operator[]
                    (local_f0,(difference_type)in_stack_fffffffffffffbb8);
          bitmap::BitmapArray<long>::value_reference::operator=
                    ((value_reference *)iVar11.pos_,(value_reference *)iVar11.array_);
          local_38 = local_38 + -1;
        }
      }
      lVar5 = *(long *)(in_R8 + (long)(local_64 * in_stack_00000010 + local_64) * 8);
      *(long *)(in_R8 + (long)(local_64 * in_stack_00000010 + local_64) * 8) = local_38 + 1;
      if (local_64 < in_stack_00000010 + -1) {
        *(long *)(in_R8 + (long)(local_64 * in_stack_00000010 + local_64 + 1) * 8) =
             (local_38 - lVar5) + 1;
      }
      local_38 = *(long *)(in_RCX + (long)local_64 * 8);
    }
  }
  return local_58;
}

Assistant:

pos_type sort_typeBstar(const StringIterator_type T, SAIterator_type SA,
                        pos_type *bucket_A, pos_type *bucket_B, pos_type n,
                        pos_type SAsize, alphabetsize_type alphabetsize) {
  pos_type i, j, k, t, m, bufsize;
  alphabetsize_type c0, c1;

  /* Initialize bucket arrays. */
  for (i = 0; i < alphabetsize; ++i) {
    bucket_A[i] = 0;
  }
  for (i = 0; i < alphabetsize * alphabetsize; ++i) {
    bucket_B[i] = 0;
  }

  /* Count the number of occurrences of the first one or two characters of each
   type A, B and B* suffix. Moreover, store the beginning position of all
   type B* suffixes into the array SA. */
  for (i = n - 1, m = SAsize; 0 <= i;) {
    /* type A suffix. */
    do {
      ++BUCKET_A(T[i]);
    } while ((0 <= --i) && (T[i] >= T[i + 1]));
    if (0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(T[i], T[i + 1]);
      SA[--m] = i;
      /* type B suffix. */
      for (--i; (0 <= i) && (T[i] <= T[i + 1]); --i) {
        ++BUCKET_B(T[i], T[i + 1]);
      }
    }
  }
  m = SAsize - m;

  /* Calculate the index of start/end point of each bucket. */
  for (c0 = 0, i = -1, j = 0; c0 < alphabetsize; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0)= i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for (c1 = c0 + 1; c1 < alphabetsize; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if (0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    SAIterator_type PAb = SA + SAsize - m, ISAb = SA + m;
    for (i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
    bufsize = SAsize - 2 * m;
    if (MERGE_BUFSIZE < bufsize) {
      SAIterator_type buf = SA + m;
      for (c0 = alphabetsize - 1, j = m; 0 < j; --c0) {
        for (c1 = alphabetsize - 1; c0 < c1; j = i, --c1) {
          i = BUCKET_BSTAR(c0, c1);
          if (1 < (j - i)) {
            substring::sort(T, PAb, SA + i, SA + j, buf, bufsize, 2, n,
                            *(SA + i) == (m - 1));
          }
        }
      }
    } else {
      pos_type *lbuf = NULL;
      int err = 0;
      try {
        lbuf = new pos_type[MERGE_BUFSIZE];
        if (lbuf == NULL) {
          throw;
        }
        for (c0 = alphabetsize - 1, j = m; 0 < j; --c0) {
          for (c1 = alphabetsize - 1; c0 < c1; j = i, --c1) {
            i = BUCKET_BSTAR(c0, c1);
            if (1 < (j - i)) {
              substring::sort(T, PAb, SA + i, SA + j, lbuf, MERGE_BUFSIZE, 2, n,
                              *(SA + i) == (m - 1));
            }
          }
        }
      } catch (...) {
        err = -1;
      }
      delete[] lbuf;
      if (err != 0) {
        throw;
      }
    }

    /* Compute ranks of type B* substrings. */
    for (i = m - 1; 0 <= i; --i) {
      if (0 <= SA[i]) {
        j = i;
        do {
          ISAb[SA[i]] = i;
        } while ((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if (i <= 0) {
          break;
        }
      }
      j = i;
      do {
        ISAb[SA[i] = ~SA[i]] = j;
      } while (SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using tandemrepeat/doubling sorting algorithms. */
    if (tandemrepeat::sort(ISAb, SA, SA + m) == false) {
      doubling::sort(ISAb, SA, SA + m);
    }

    /* Set the sorted order of tyoe B* suffixes. */
    for (i = n - 1, j = m; 0 <= i;) {
      for (--i; (0 <= i) && (T[i] >= T[i + 1]); --i) {
      }
      if (0 <= i) {
        SA[ISAb[--j]] = i;
        for (--i; (0 <= i) && (T[i] <= T[i + 1]); --i) {
        }
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    for (c0 = alphabetsize - 1, i = n - 1, k = m - 1; 0 <= c0; --c0) {
      for (c1 = alphabetsize - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i + 1; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for (i = t, j = BUCKET_BSTAR(c0, c1); j <= k; --i, --k) {
          SA[i] = SA[k];
        }
      }
      t = i - BUCKET_B(c0, c0);
      BUCKET_B(c0, c0) = i + 1; /* end point */
      if (c0 < (alphabetsize - 1)) {
        BUCKET_BSTAR(c0, c0 + 1) = t + 1; /* start point */
      }
      i = BUCKET_A(c0);
    }
  }

  return m;
}